

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

iterator __thiscall
duckdb_re2::SparseArray<int>::SetInternal(SparseArray<int> *this,bool allow_existing,int i,int *v)

{
  bool bVar1;
  uint uVar2;
  SparseArray<int> *in_RCX;
  uint in_EDX;
  undefined1 in_SIL;
  SparseArray<int> *in_RDI;
  SparseArray<int> *in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined3 in_stack_ffffffffffffffec;
  uint i_00;
  undefined8 local_8;
  
  i_00 = CONCAT13(in_SIL,in_stack_ffffffffffffffec) & 0x1ffffff;
  DebugCheckInvariants(in_RDI);
  uVar3 = in_EDX;
  uVar2 = max_size(in_stack_ffffffffffffffc8);
  if (in_EDX < uVar2) {
    if ((i_00 & 0x1000000) == 0) {
      create_index(in_RCX,in_EDX);
    }
    else {
      bVar1 = has_index((SparseArray<int> *)CONCAT44(i_00,uVar3),(int)((ulong)in_RCX >> 0x20));
      if (!bVar1) {
        create_index(in_RCX,in_EDX);
      }
    }
    local_8 = SetExistingInternal(in_RDI,i_00,&in_RCX->size_);
  }
  else {
    local_8 = begin((SparseArray<int> *)0x836770);
  }
  return local_8;
}

Assistant:

iterator SetInternal(bool allow_existing, int i, const Value& v) {
    DebugCheckInvariants();
    if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
      assert(false && "illegal index");
      // Semantically, end() would be better here, but we already know
      // the user did something stupid, so begin() insulates them from
      // dereferencing an invalid pointer.
      return begin();
    }
    if (!allow_existing) {
      assert(!has_index(i));
      create_index(i);
    } else {
      if (!has_index(i))
        create_index(i);
    }
    return SetExistingInternal(i, v);
  }